

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcColumn::IfcColumn(IfcColumn *this)

{
  IfcColumn *this_local;
  
  STEP::Object::Object((Object *)&(this->super_IfcBuildingElement).field_0x158,"IfcColumn");
  IfcBuildingElement::IfcBuildingElement
            (&this->super_IfcBuildingElement,&PTR_construction_vtable_24__00f65070);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcColumn,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcColumn,_0UL> *)
             &(this->super_IfcBuildingElement).super_IfcElement.field_0x148,
             &PTR_construction_vtable_24__00f651a8);
  *(undefined8 *)&(this->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.super_IfcObject
       = 0xf64f40;
  *(undefined8 *)&(this->super_IfcBuildingElement).field_0x158 = 0xf65058;
  *(undefined8 *)
   &(this->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.super_IfcObject.field_0x88 =
       0xf64f68;
  (this->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0xf64f90;
  *(undefined8 *)
   &(this->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.super_IfcObject.field_0xd0 =
       0xf64fb8;
  *(undefined8 *)&(this->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.field_0x100 =
       0xf64fe0;
  *(undefined8 *)&(this->super_IfcBuildingElement).super_IfcElement.field_0x138 = 0xf65008;
  *(undefined8 *)&(this->super_IfcBuildingElement).super_IfcElement.field_0x148 = 0xf65030;
  return;
}

Assistant:

IfcColumn() : Object("IfcColumn") {}